

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int sort_comp(lua_State *L,int a,int b)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  lua_State *in_RDI;
  int res;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  iVar1 = lua_type(in_RDI,in_ESI);
  if (iVar1 == 0) {
    local_4 = lua_lessthan(in_RDI,in_ESI,in_EDX);
  }
  else {
    lua_pushvalue(in_RDI,in_ESI);
    lua_pushvalue(in_RDI,in_ESI);
    lua_pushvalue(in_RDI,in_ESI);
    lua_call((lua_State *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    local_4 = lua_toboolean(in_RDI,in_ESI);
    lua_settop(in_RDI,-2);
  }
  return local_4;
}

Assistant:

static int sort_comp(lua_State*L,int a,int b){
if(!lua_isnil(L,2)){
int res;
lua_pushvalue(L,2);
lua_pushvalue(L,a-1);
lua_pushvalue(L,b-2);
lua_call(L,2,1);
res=lua_toboolean(L,-1);
lua_pop(L,1);
return res;
}
else
return lua_lessthan(L,a,b);
}